

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_fill_empty_from_part(REF_INTERP ref_interp,REF_INT *from_part)

{
  uint uVar1;
  bool local_65;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_EDGE ref_edge;
  int local_40;
  REF_INT node;
  REF_INT nsweeps;
  REF_BOOL again;
  REF_NODE from_node;
  REF_GRID from_grid;
  REF_MPI ref_mpi;
  REF_INT *from_part_local;
  REF_INTERP ref_interp_local;
  
  from_grid = (REF_GRID)ref_interp->ref_mpi;
  from_node = (REF_NODE)ref_interp->from_grid;
  _nsweeps = ((REF_GRID)from_node)->node;
  ref_mpi = (REF_MPI)from_part;
  from_part_local = (REF_INT *)ref_interp;
  uVar1 = ref_edge_create((REF_EDGE *)&ref_private_macro_code_rss_1,(REF_GRID)from_node);
  if (uVar1 == 0) {
    local_40 = 0;
    node = 1;
    do {
      if (node == 0) {
        uVar1 = ref_edge_free(_ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xaa7,"ref_interp_fill_empty_from_part",(ulong)uVar1,"ref_edge free");
          return uVar1;
        }
        return 0;
      }
      local_40 = local_40 + 1;
      node = 0;
      for (ref_edge._4_4_ = 0; ref_edge._4_4_ < _nsweeps->max; ref_edge._4_4_ = ref_edge._4_4_ + 1)
      {
        if ((((-1 < ref_edge._4_4_) && (ref_edge._4_4_ < _nsweeps->max)) &&
            (-1 < _nsweeps->global[ref_edge._4_4_])) &&
           ((_nsweeps->ref_mpi->id == _nsweeps->part[ref_edge._4_4_] &&
            ((&ref_mpi->n)[ref_edge._4_4_] == -1)))) {
          uVar1 = ref_interp_from_part_neighbor
                            (_ref_private_macro_code_rss_1,&ref_mpi->n,ref_edge._4_4_);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0xa9d,"ref_interp_fill_empty_from_part",(ulong)uVar1,"fill");
            return uVar1;
          }
          local_65 = true;
          if (node == 0) {
            local_65 = (&ref_mpi->n)[ref_edge._4_4_] == -1;
          }
          node = (REF_INT)local_65;
        }
      }
      uVar1 = ref_mpi_all_or((REF_MPI)from_grid,&node);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xaa1,"ref_interp_fill_empty_from_part",(ulong)uVar1,"mpi all or");
        return uVar1;
      }
      uVar1 = ref_node_ghost_int(_nsweeps,&ref_mpi->n,1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xaa2,"ref_interp_fill_empty_from_part",(ulong)uVar1,"ghost from_part");
        return uVar1;
      }
    } while (local_40 != 200);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xaa4,
           "ref_interp_fill_empty_from_part","too many sweeps, stop inf loop");
    ref_interp_local._4_4_ = 1;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xa94,
           "ref_interp_fill_empty_from_part",(ulong)uVar1,"edges");
    ref_interp_local._4_4_ = uVar1;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_fill_empty_from_part(REF_INTERP ref_interp,
                                                          REF_INT *from_part) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_BOOL again;
  REF_INT nsweeps, node;
  REF_EDGE ref_edge;

  RSS(ref_edge_create(&ref_edge, from_grid), "edges");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;
    each_ref_node_valid_node(from_node, node) {
      if (ref_node_owned(from_node, node) && REF_EMPTY == from_part[node]) {
        RSS(ref_interp_from_part_neighbor(ref_edge, from_part, node), "fill");
        again = again || REF_EMPTY == from_part[node];
      }
    }
    RSS(ref_mpi_all_or(ref_mpi, &again), "mpi all or");
    RSS(ref_node_ghost_int(from_node, from_part, 1), "ghost from_part");

    RUS(200, nsweeps, "too many sweeps, stop inf loop");
  }

  RSS(ref_edge_free(ref_edge), "ref_edge free");

  return REF_SUCCESS;
}